

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_invalidate_phys_page_range_mips
               (uc_struct_conflict4 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  PageDesc *pages;
  page_collection *mem;
  tb_page_addr_t in_R8;
  uintptr_t in_R9;
  
  pages = page_find_alloc(uc,start >> 0xc,0);
  if (pages != (PageDesc *)0x0) {
    mem = page_collection_lock_mips(uc,start,end);
    tb_invalidate_phys_page_range__locked
              (uc,(page_collection *)pages,(PageDesc *)start,end,in_R8,in_R9);
    g_tree_destroy(mem->tree);
    g_free(mem);
    return;
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_range(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *pages;
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (p == NULL) {
        return;
    }
    pages = page_collection_lock(uc, start, end);
    tb_invalidate_phys_page_range__locked(uc, pages, p, start, end, 0);
    page_collection_unlock(pages);
}